

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

string * __thiscall pbrt::SurfaceInteraction::ToString_abi_cxx11_(SurfaceInteraction *this)

{
  bool bVar1;
  int *unaff_RBX;
  Point2<float> *in_RSI;
  string *in_RDI;
  MaterialHandle *in_stack_fffffffffffffdc8;
  MediumInterface *in_stack_fffffffffffffe38;
  char *local_1b8;
  Vector3<float> *local_1a8;
  Normal3<float> *local_150;
  float *local_148;
  Normal3<float> *args_1;
  float *args;
  float *fmt;
  string local_100 [32];
  char *local_e0;
  byte local_d1;
  float *in_stack_ffffffffffffff30;
  char **in_stack_ffffffffffffff38;
  char **in_stack_ffffffffffffff40;
  Vector3<float> *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Normal3<float> *in_stack_ffffffffffffff60;
  Normal3<float> *in_stack_ffffffffffffff68;
  Vector3<float> *in_stack_ffffffffffffff70;
  Vector3<float> *in_stack_ffffffffffffff78;
  Normal3<float> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar2;
  char **in_stack_ffffffffffffff98;
  Vector3<float> *in_stack_ffffffffffffffa0;
  Vector3<float> *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffb0;
  Point2<float> *args_22;
  string *args_23;
  
  args_1 = (Normal3<float> *)(in_RSI + 5);
  args = &in_RSI[6].super_Tuple2<pbrt::Point2,_float>.y;
  fmt = &in_RSI[3].super_Tuple2<pbrt::Point2,_float>.y;
  args_22 = in_RSI;
  args_23 = in_RDI;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 9));
  bVar2 = 0;
  if (bVar1) {
    MediumHandle::ToString_abi_cxx11_((MediumHandle *)in_stack_fffffffffffffdc8);
    bVar2 = 1;
    local_148 = (float *)std::__cxx11::string::c_str();
  }
  else {
    local_148 = (float *)0x94f095;
  }
  in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 & 0xffffff;
  if (in_RSI[8].super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0) {
    local_150 = (Normal3<float> *)0x94f095;
  }
  else {
    MediumInterface::ToString_abi_cxx11_(in_stack_fffffffffffffe38);
    in_stack_ffffffffffffff58 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
    local_150 = (Normal3<float> *)std::__cxx11::string::c_str();
  }
  local_d1 = 0;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x18));
  if (bVar1) {
    MaterialHandle::ToString_abi_cxx11_(in_stack_fffffffffffffdc8);
    local_d1 = 1;
    local_1a8 = (Vector3<float> *)std::__cxx11::string::c_str();
  }
  else {
    local_1a8 = (Vector3<float> *)0x94f095;
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x19));
  if (bVar1) {
    LightHandle::ToString_abi_cxx11_((LightHandle *)in_stack_fffffffffffffdc8);
    local_1b8 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_1b8 = "(nullptr)";
  }
  local_e0 = local_1b8;
  StringPrintf<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
            ((char *)fmt,(Point3fi *)args,args_1,in_RSI,(Vector3<float> *)in_RDI,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff48,local_1a8,
             (Normal3<float> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,local_150,
             (char **)CONCAT17(bVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff98,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,local_148
             ,(float *)args_22,(float *)args_23,unaff_RBX);
  if (bVar1) {
    std::__cxx11::string::~string(local_100);
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  }
  if ((in_stack_ffffffffffffff58 & 0x1000000) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

std::string SurfaceInteraction::ToString() const {
    return StringPrintf(
        "[ SurfaceInteraction pi: %s n: %s uv: %s wo: %s time: %s "
        "medium: %s mediumInterface: %s dpdu: %s dpdv: %s dndu: %s dndv: %s "
        "shading.n: %s shading.dpdu: %s shading.dpdv: %s "
        "shading.dndu: %s shading.dndv: %s material: %s "
        "areaLight: %s dpdx: %s dpdy: %s dudx: %f dvdx: %f "
        "dudy: %f dvdy: %f faceIndex: %d ]",
        pi, n, uv, wo, time, medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)", dpdu, dpdv,
        dndu, dndv, shading.n, shading.dpdu, shading.dpdv, shading.dndu, shading.dndv,
        material ? material.ToString().c_str() : "(nullptr)",
        areaLight ? areaLight.ToString().c_str() : "(nullptr)", dpdx, dpdy, dudx, dvdx,
        dudy, dvdy, faceIndex);
}